

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Statements.cpp
# Opt level: O0

bool __thiscall
psy::C::Parser::parseSwitchStatement_AtFirst
          (Parser *this,StatementSyntax **stmt,StatementContext stmtCtx)

{
  bool bVar1;
  StatementContext stmtCtx_00;
  SyntaxKind SVar2;
  SyntaxToken *this_00;
  ostream *poVar3;
  SwitchStatementSyntax *pSVar4;
  IndexType IVar5;
  bool local_39;
  SwitchStatementSyntax *switchStmt;
  StatementContext stmtCtx_local;
  StatementSyntax **stmt_local;
  Parser *this_local;
  
  this_00 = peek(this,1);
  SVar2 = SyntaxToken::kind(this_00);
  if (SVar2 == Keyword_switch) {
    pSVar4 = makeNode<psy::C::SwitchStatementSyntax>(this);
    *stmt = &pSVar4->super_StatementSyntax;
    IVar5 = consume(this);
    pSVar4->switchKwTkIdx_ = IVar5;
    bVar1 = match(this,OpenParenToken,&pSVar4->openParenTkIdx_);
    local_39 = false;
    if (bVar1) {
      bVar1 = parseExpression(this,&pSVar4->cond_);
      local_39 = false;
      if (bVar1) {
        bVar1 = match(this,CloseParenToken,&pSVar4->closeParenTkIdx_);
        local_39 = false;
        if (bVar1) {
          stmtCtx_00 = operator+(stmtCtx,Switch);
          local_39 = parseStatement(this,&pSVar4->stmt_,stmtCtx_00);
        }
      }
    }
    this_local._7_1_ = checkStatementParse(this,local_39);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/parser/Parser_Statements.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,499);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = std::operator<<(poVar3,"assert failure: `switch\'");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::parseSwitchStatement_AtFirst(StatementSyntax*& stmt,
                                          StatementContext stmtCtx)
{
    DBG_THIS_RULE();
    PSY_ASSERT_3(peek().kind() == SyntaxKind::Keyword_switch,
                     return false,
                     "assert failure: `switch'");

    auto switchStmt = makeNode<SwitchStatementSyntax>();
    stmt = switchStmt;
    switchStmt->switchKwTkIdx_ = consume();

    return checkStatementParse(
                match(SyntaxKind::OpenParenToken, &switchStmt->openParenTkIdx_)
                && parseExpression(switchStmt->cond_)
                && match(SyntaxKind::CloseParenToken, &switchStmt->closeParenTkIdx_)
                && parseStatement(switchStmt->stmt_,
                                  stmtCtx + StatementContext::Switch));
}